

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O3

void Cgt_ClockGatingRangeCheck(Cgt_Man_t *p,int iStart,int nOutputs)

{
  Vec_Ptr_t *vCands;
  Aig_Man_t *pAig;
  void *pvVar1;
  Aig_Obj_t *pCandPart;
  Aig_Obj_t *pMiterPart;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Vec_Vec_t *p_00;
  void *Entry;
  
  if (p->vGatesAll->nSize != p->pFrame->nObjs[3]) {
    __assert_fail("Vec_VecSize(p->vGatesAll) == Aig_ManCoNum(p->pFrame)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtCore.c"
                  ,0x87,"void Cgt_ClockGatingRangeCheck(Cgt_Man_t *, int, int)");
  }
  if (0 < nOutputs) {
    vCands = p->vFanout;
    iVar4 = nOutputs + iStart;
    do {
      pAig = p->pAig;
      uVar2 = pAig->nTruePos + iStart;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar2];
      Cgt_ManDetectCandidates
                (pAig,p->vUseful,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),
                 p->pPars->nLevelMax,vCands);
      if (0 < vCands->nSize) {
        lVar5 = 0;
        do {
          Entry = vCands->pArray[lVar5];
          pCandPart = *(Aig_Obj_t **)(*(long *)((long)Entry + 0x28) + 0x28);
          pMiterPart = *(Aig_Obj_t **)(*(long *)((long)pvVar1 + 0x28) + 0x28);
          iVar3 = Cgt_SimulationFilter(p,pCandPart,pMiterPart);
          if (iVar3 == 0) {
            p->nCallsFiltered = p->nCallsFiltered + 1;
LAB_004f37db:
            iVar3 = Cgt_SimulationFilter(p,(Aig_Obj_t *)((ulong)pCandPart ^ 1),pMiterPart);
            if (iVar3 == 0) {
              p->nCallsFiltered = p->nCallsFiltered + 1;
            }
            else {
              iVar3 = Cgt_CheckImplication(p,(Aig_Obj_t *)((ulong)pCandPart ^ 1),pMiterPart);
              if (iVar3 == 0) {
                Cgt_SimulationRecord(p);
              }
              else if (iVar3 == 1) {
                p_00 = p->vGatesAll;
                Entry = (void *)((ulong)Entry ^ 1);
                goto LAB_004f3810;
              }
            }
          }
          else {
            iVar3 = Cgt_CheckImplication(p,pCandPart,pMiterPart);
            if (iVar3 == 0) {
              Cgt_SimulationRecord(p);
              goto LAB_004f37db;
            }
            if (iVar3 != 1) goto LAB_004f37db;
            p_00 = p->vGatesAll;
LAB_004f3810:
            Vec_VecPush(p_00,iStart,Entry);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < vCands->nSize);
      }
      iStart = iStart + 1;
    } while (iStart < iVar4);
  }
  return;
}

Assistant:

void Cgt_ClockGatingRangeCheck( Cgt_Man_t * p, int iStart, int nOutputs )
{
    Vec_Ptr_t * vNodes = p->vFanout;
    Aig_Obj_t * pMiter, * pCand, * pMiterFrame, * pCandFrame, * pMiterPart, * pCandPart;
    int i, k, RetValue, nCalls;
    assert( Vec_VecSize(p->vGatesAll) == Aig_ManCoNum(p->pFrame) );
    // go through all the registers inputs of this range
    for ( i = iStart; i < iStart + nOutputs; i++ )
    {
        nCalls = p->nCalls;
        pMiter = Saig_ManLi( p->pAig, i );
        Cgt_ManDetectCandidates( p->pAig, p->vUseful, Aig_ObjFanin0(pMiter), p->pPars->nLevelMax, vNodes );
        // go through the candidates of this PO
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pCand, k )
        {
            // get the corresponding nodes from the frames
            pCandFrame  = (Aig_Obj_t *)pCand->pData;
            pMiterFrame = (Aig_Obj_t *)pMiter->pData;
            // get the corresponding nodes from the part
            pCandPart   = (Aig_Obj_t *)pCandFrame->pData;
            pMiterPart  = (Aig_Obj_t *)pMiterFrame->pData;
            // try direct polarity
            if ( Cgt_SimulationFilter( p, pCandPart, pMiterPart ) )
            {
                RetValue = Cgt_CheckImplication( p, pCandPart, pMiterPart );
                if ( RetValue == 1 )
                {
                    Vec_VecPush( p->vGatesAll, i, pCand );
                    continue;
                }
                if ( RetValue == 0 )
                    Cgt_SimulationRecord( p );
            }
            else
                p->nCallsFiltered++;
            // try reverse polarity
            if ( Cgt_SimulationFilter( p, Aig_Not(pCandPart), pMiterPart ) )
            {
                RetValue = Cgt_CheckImplication( p, Aig_Not(pCandPart), pMiterPart );
                if ( RetValue == 1 )
                {
                    Vec_VecPush( p->vGatesAll, i, Aig_Not(pCand) );
                    continue;
                }
                if ( RetValue == 0 )
                    Cgt_SimulationRecord( p );
            }
            else
                p->nCallsFiltered++;
        }

        if ( p->pPars->fVerbose )
        {
//            printf( "Flop %3d : Cand = %4d. Gate = %4d. SAT calls = %3d.\n", 
//                i, Vec_PtrSize(vNodes), Vec_PtrSize(Vec_VecEntry(p->vGatesAll, i)), p->nCalls-nCalls );
        }

    }
}